

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

CURLcode file_do(connectdata *conn,_Bool *done)

{
  bool bVar1;
  Curl_easy *data_00;
  Curl_easy *pCVar2;
  undefined8 *puVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  curl_off_t cVar10;
  long lVar11;
  ushort **ppuVar12;
  __off64_t _Var13;
  size_t len;
  size_t sVar14;
  long lVar15;
  undefined8 uVar16;
  Curl_easy *data;
  char *pcVar17;
  __off_t size;
  byte bVar18;
  size_t sVar19;
  long lVar20;
  char *pcVar21;
  size_t sVar22;
  bool bVar23;
  timeval tVar24;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data_00 = conn->data;
  pcVar17 = (data_00->state).buffer;
  *done = true;
  Curl_initinfo(data_00);
  Curl_pgrsStartNow(data_00);
  pCVar2 = conn->data;
  puVar3 = (undefined8 *)(pCVar2->req).protop;
  if ((data_00->set).upload != true) {
    iVar5 = *(int *)(puVar3 + 2);
    iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
    size = statbuf.st_size;
    if (iVar7 == -1) {
      size = 0;
    }
    else {
      (data_00->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data_00->state).range == (char *)0x0) &&
          ((data_00->set).timecondition != CURL_TIMECOND_NONE)) &&
         (_Var4 = Curl_meets_timecondition(data_00,statbuf.st_mtim.tv_sec), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
    }
    if ((((data_00->set).opt_no_body == true) && (iVar7 != -1)) &&
       ((data_00->set).include_header != false)) {
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar6 = Curl_client_write(conn,3,header,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      iVar5 = 6;
      if (buffer.tm_wday != 0) {
        iVar5 = buffer.tm_wday + -1;
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar5],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar6 = Curl_client_write(conn,3,pcVar17,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      Curl_pgrsSetDownloadSize(data_00,size);
      return CURLE_OK;
    }
    pCVar2 = conn->data;
    lVar20 = -1;
    lVar11 = 0xd0;
    if (((pCVar2->state).use_range == true) &&
       (pcVar21 = (pCVar2->state).range, pcVar21 != (char *)0x0)) {
      lVar20 = strtol(pcVar21,(char **)header,0);
      bVar18 = *(byte *)header._0_8_;
      pcVar21 = (char *)header._0_8_;
      if (bVar18 != 0) {
        ppuVar12 = __ctype_b_loc();
        do {
          if ((bVar18 != 0x2d) && (((*ppuVar12)[bVar18] & 0x2000) == 0)) break;
          bVar18 = pcVar21[1];
          pcVar21 = pcVar21 + 1;
        } while (bVar18 != 0);
      }
      header._0_8_ = pcVar21;
      lVar11 = strtol(pcVar21,(char **)&buffer,0);
      lVar15 = -1;
      if (pcVar21 != (char *)CONCAT44(buffer.tm_min,buffer.tm_sec)) {
        lVar15 = lVar11;
      }
      lVar11 = 0x4eb8;
      if (lVar15 != -1 || lVar20 < 0) {
        lVar15 = (lVar15 - lVar20) + 1;
        if (lVar20 < 0) {
          lVar15 = -lVar20;
        }
        (pCVar2->req).maxdownload = lVar15;
      }
    }
    *(long *)((long)pCVar2->sockets + lVar11 + -0x80) = lVar20;
    cVar10 = (data_00->state).resume_from;
    if (cVar10 < 0) {
      if (iVar7 == -1) {
        Curl_failf(data_00,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      cVar10 = cVar10 + statbuf.st_size;
      (data_00->state).resume_from = cVar10;
    }
    if (size < cVar10) {
      Curl_failf(data_00,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    lVar20 = (data_00->req).maxdownload;
    lVar11 = size - cVar10;
    if (0 < lVar20) {
      lVar11 = lVar20;
    }
    bVar23 = lVar11 != 0;
    if (iVar7 != -1) {
      Curl_pgrsSetDownloadSize(data_00,lVar11);
      cVar10 = (data_00->state).resume_from;
    }
    if ((cVar10 != 0) && (_Var13 = lseek64(iVar5,cVar10,0), cVar10 != _Var13)) {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar1 = iVar7 != -1 && bVar23;
    Curl_pgrsTime(data_00,TIMER_STARTTRANSFER);
    lVar20 = 0;
    while( true ) {
      sVar19 = (data_00->set).buffer_size;
      if (iVar7 != -1 && bVar23) {
        if (lVar11 < (long)sVar19) {
          sVar19 = curlx_sotouz(lVar11);
        }
      }
      else {
        sVar19 = sVar19 - 1;
      }
      len = read(iVar5,pcVar17,sVar19);
      CVar6 = CURLE_OK;
      if (((long)len < 1) || (pcVar17[len] = '\0', CVar6 = CURLE_OK, bVar1 && lVar11 == 0))
      goto LAB_00134f3d;
      sVar22 = 0;
      if (bVar1) {
        sVar22 = len;
      }
      CVar6 = Curl_client_write(conn,1,pcVar17,len);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      lVar20 = lVar20 + len;
      Curl_pgrsSetDownloadCounter(data_00,lVar20);
      iVar8 = Curl_pgrsUpdate(conn);
      if (iVar8 != 0) break;
      lVar11 = lVar11 - sVar22;
      tVar24 = curlx_tvnow();
      CVar6 = Curl_speedcheck(data_00,tVar24);
      if (CVar6 != CURLE_OK) {
LAB_00134f3d:
        iVar5 = Curl_pgrsUpdate(conn);
        if (iVar5 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar6;
      }
    }
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
    goto LAB_00134f3d;
  }
  pcVar17 = (char *)*puVar3;
  pcVar9 = strchr(pcVar17,0x2f);
  pcVar21 = (pCVar2->state).buffer;
  (pCVar2->req).upload_fromhere = pcVar21;
  if (pcVar9 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar9[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar5 = open64(pcVar17,(uint)((pCVar2->state).resume_from != 0) * 0x200 + 0x241,
                 (pCVar2->set).new_file_perms);
  if (iVar5 < 0) {
    uVar16 = *puVar3;
    pcVar17 = "Can\'t open %s for writing";
LAB_00134f25:
    Curl_failf(pCVar2,pcVar17,uVar16);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar20 = (pCVar2->state).infilesize;
    if (lVar20 != -1) {
      Curl_pgrsSetUploadSize(pCVar2,lVar20);
    }
    if ((pCVar2->state).resume_from < 0) {
      iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
      if (iVar7 != 0) {
        close(iVar5);
        uVar16 = *puVar3;
        pcVar17 = "Can\'t get the size of %s";
        goto LAB_00134f25;
      }
      (pCVar2->state).resume_from = statbuf.st_size;
    }
    lVar20 = 0;
    while (CVar6 = Curl_fillreadbuffer(conn,(int)(pCVar2->set).buffer_size,(int *)header),
          CVar6 == CURLE_OK) {
      sVar19 = (size_t)(int)header._0_4_;
      if ((long)sVar19 < 1) {
        iVar7 = Curl_pgrsUpdate(conn);
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
        if (iVar7 == 0) {
          CVar6 = CURLE_OK;
        }
        break;
      }
      lVar11 = (pCVar2->state).resume_from;
      pcVar17 = pcVar21;
      if (lVar11 != 0) {
        lVar15 = 0;
        if (lVar11 < (long)sVar19) {
          lVar15 = lVar11;
        }
        sVar14 = -(lVar11 - sVar19);
        cVar10 = lVar11 - sVar19;
        if (lVar11 < (long)sVar19) {
          cVar10 = 0;
        }
        else {
          sVar14 = 0;
        }
        (pCVar2->state).resume_from = cVar10;
        pcVar17 = pcVar21 + lVar15;
        sVar19 = sVar14;
      }
      sVar14 = write(iVar5,pcVar17,sVar19);
      if (sVar14 != sVar19) {
        CVar6 = CURLE_SEND_ERROR;
        break;
      }
      lVar20 = lVar20 + sVar19;
      Curl_pgrsSetUploadCounter(pCVar2,lVar20);
      iVar7 = Curl_pgrsUpdate(conn);
      if (iVar7 != 0) {
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
        break;
      }
      tVar24 = curlx_tvnow();
      CVar6 = Curl_speedcheck(pCVar2,tVar24);
      if (CVar6 != CURLE_OK) break;
    }
    close(iVar5);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size=0;
  bool size_known;
  bool fstated=FALSE;
  ssize_t nread;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = (long)statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, (time_t)data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    snprintf(header, sizeof(header),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    snprintf(header, sizeof(header),
             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
             Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
             tm->tm_mday,
             Curl_month[tm->tm_mon],
             tm->tm_year + 1900,
             tm->tm_hour,
             tm->tm_min,
             tm->tm_sec);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    if(!result)
      /* set the file size to make it available post transfer */
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  file_range(conn);

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_tvnow());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}